

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O0

void onebyte(list a,int pos)

{
  list plVar1;
  int iVar2;
  int local_44;
  int size;
  list tn;
  list t;
  character chmax;
  character chmin;
  character prevch;
  character ch;
  bucket_conflict1 *bp;
  list plStack_10;
  int pos_local;
  list a_local;
  
  t._4_4_ = 0xff;
  t._0_4_ = 0;
  local_44 = 1;
  chmax = (character)a->str[pos];
  iVar2 = local_44;
  plVar1 = a;
  bp._4_4_ = pos;
  plStack_10 = a;
  while (tn = plVar1, local_44 = iVar2, plVar1 = tn->next, plVar1 != (list)0x0) {
    chmin = (character)plVar1->str[bp._4_4_];
    iVar2 = local_44 + 1;
    if (chmin != chmax) {
      intobucket1(onebyte::b + chmax,plStack_10,tn,local_44,chmax,(character *)((long)&t + 4),
                  (character *)&t);
      chmax = chmin;
      local_44 = 1;
      iVar2 = local_44;
      plStack_10 = plVar1;
    }
  }
  intobucket1(onebyte::b + chmax,plStack_10,tn,local_44,chmax,(character *)((long)&t + 4),
              (character *)&t);
  if (onebyte::b[0].head != (list)0x0) {
    onebyte::b[0].size = 0;
    ontostack(onebyte::b,bp._4_4_);
  }
  for (_prevch = onebyte::b + t._4_4_; _prevch <= onebyte::b + (int)t; _prevch = _prevch + 1) {
    if (_prevch->head != (list)0x0) {
      ontostack(_prevch,bp._4_4_ + 1);
    }
  }
  return;
}

Assistant:

static inline void onebyte(list a, int pos)
{
   static bucket b[CHARS];
   bucket *bp;
   character ch, prevch;
   character chmin = CHARS-1, chmax = 0;
   list t = a, tn;
   int size = 1;

   prevch = CHAR(t->str, pos);           /* into buckets */
   for ( ; (tn = t->next); t = tn) {
      ch = CHAR(tn->str, pos); size++;
      if (ch == prevch) continue;
      intobucket1(b+prevch,a, t, size-1, prevch, &chmin, &chmax);
      a = tn;
      prevch = ch; size = 1;
   }
   intobucket1(b+prevch, a, t, size, prevch, &chmin, &chmax);

   if (b->head) {    /* ch = '\0', end of string */
      b->size = 0;   /* finished */
      ontostack(b, pos);
   }
   for (bp = b + chmin; bp <= b + chmax; bp++)
      if (bp->head) ontostack(bp, pos+1);
}